

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O0

bool decendingLessThan(pair<QString,_int> *s1,pair<QString,_int> *s2)

{
  bool bVar1;
  QString *in_RSI;
  QString *in_stack_ffffffffffffffe8;
  
  bVar1 = operator>(in_RSI,in_stack_ffffffffffffffe8);
  return bVar1;
}

Assistant:

static bool decendingLessThan(const std::pair<QString, int> &s1, const std::pair<QString, int> &s2)
{
    return s1.first > s2.first;
}